

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int markpara(int f,int n)

{
  mgwin *pmVar1;
  uint in_EAX;
  int iVar2;
  undefined8 uStack_28;
  int i;
  
  uStack_28 = (ulong)in_EAX;
  if (n != 0) {
    clearmark(7,0);
    iVar2 = findpara();
    if (iVar2 != 0) {
      do_gotoeop(8,n,(int *)((long)&uStack_28 + 4));
      pmVar1 = curwp;
      curwp->w_markp = curwp->w_dotp;
      pmVar1->w_marko = pmVar1->w_doto;
      gotobop(8,uStack_28._4_4_);
    }
  }
  return 1;
}

Assistant:

int
markpara(int f, int n)
{
	int i = 0;

	if (n == 0)
		return (TRUE);

	clearmark(FFARG, 0);

	if (findpara() == FALSE)
		return (TRUE);

	(void)do_gotoeop(FFRAND, n, &i);

	/* set the mark here */
	curwp->w_markp = curwp->w_dotp;
	curwp->w_marko = curwp->w_doto;

	(void)gotobop(FFRAND, i);

	return (TRUE);
}